

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zero_copy_stream_impl_lite.cc
# Opt level: O3

int64_t __thiscall google::protobuf::io::StringOutputStream::ByteCount(StringOutputStream *this)

{
  LogMessage *other;
  string *psVar1;
  LogMessage local_58;
  LogFinisher local_19;
  
  psVar1 = this->target_;
  if (psVar1 == (string *)0x0) {
    internal::LogMessage::LogMessage
              (&local_58,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/LLNL[P]wcs/build_O3/src/src/google/protobuf/io/zero_copy_stream_impl_lite.cc"
               ,0xb4);
    other = internal::LogMessage::operator<<(&local_58,"CHECK failed: target_ != NULL: ");
    internal::LogFinisher::operator=(&local_19,other);
    internal::LogMessage::~LogMessage(&local_58);
    psVar1 = this->target_;
  }
  return psVar1->_M_string_length;
}

Assistant:

int64_t StringOutputStream::ByteCount() const {
  GOOGLE_CHECK(target_ != NULL);
  return target_->size();
}